

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

bool Input::getMouse(int button)

{
  Input *pIVar1;
  int button_local;
  
  pIVar1 = getInstance();
  return (bool)(pIVar1->mouse[button] & 1);
}

Assistant:

bool Input::getMouse(int button)
{
	return Input::getInstance()->mouse[button];
}